

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QMimeGlobPattern>::emplace<QMimeGlobPattern_const&>
          (QMovableArrayOps<QMimeGlobPattern> *this,qsizetype i,QMimeGlobPattern *args)

{
  QMimeGlobPattern **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_90;
  QMimeGlobPattern tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QMimeGlobPattern>).
           super_QArrayDataPointer<QMimeGlobPattern>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QMimeGlobPattern>).super_QArrayDataPointer<QMimeGlobPattern>.
        size == i) {
      qVar5 = QArrayDataPointer<QMimeGlobPattern>::freeSpaceAtEnd
                        ((QArrayDataPointer<QMimeGlobPattern> *)this);
      if (qVar5 == 0) goto LAB_004461c2;
      QMimeGlobPattern::QMimeGlobPattern
                ((this->super_QGenericArrayOps<QMimeGlobPattern>).
                 super_QArrayDataPointer<QMimeGlobPattern>.ptr +
                 (this->super_QGenericArrayOps<QMimeGlobPattern>).
                 super_QArrayDataPointer<QMimeGlobPattern>.size,args);
LAB_004462b5:
      pqVar2 = &(this->super_QGenericArrayOps<QMimeGlobPattern>).
                super_QArrayDataPointer<QMimeGlobPattern>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00446274;
    }
LAB_004461c2:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QMimeGlobPattern>::freeSpaceAtBegin
                        ((QArrayDataPointer<QMimeGlobPattern> *)this);
      if (qVar5 != 0) {
        QMimeGlobPattern::QMimeGlobPattern
                  ((this->super_QGenericArrayOps<QMimeGlobPattern>).
                   super_QArrayDataPointer<QMimeGlobPattern>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QMimeGlobPattern>).
                   super_QArrayDataPointer<QMimeGlobPattern>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_004462b5;
      }
    }
  }
  tmp._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.m_mimeType.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_mimeType.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_pattern.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_mimeType.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_pattern.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_pattern.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QMimeGlobPattern::QMimeGlobPattern(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QMimeGlobPattern>).super_QArrayDataPointer<QMimeGlobPattern>
          .size != 0;
  QArrayDataPointer<QMimeGlobPattern>::detachAndGrow
            ((QArrayDataPointer<QMimeGlobPattern> *)this,(uint)(i == 0 && bVar6),1,
             (QMimeGlobPattern **)0x0,(QArrayDataPointer<QMimeGlobPattern> *)0x0);
  if (i == 0 && bVar6) {
    QMimeGlobPattern::QMimeGlobPattern
              ((this->super_QGenericArrayOps<QMimeGlobPattern>).
               super_QArrayDataPointer<QMimeGlobPattern>.ptr + -1,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QMimeGlobPattern>).
               super_QArrayDataPointer<QMimeGlobPattern>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QMimeGlobPattern>).
              super_QArrayDataPointer<QMimeGlobPattern>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_90,(QArrayDataPointer<QMimeGlobPattern> *)this,i,1);
    QMimeGlobPattern::QMimeGlobPattern(local_90.displaceFrom,&tmp);
    local_90.displaceFrom = local_90.displaceFrom + 1;
    (local_90.data)->size = (local_90.data)->size + local_90.nInserts;
  }
  QMimeGlobPattern::~QMimeGlobPattern(&tmp);
LAB_00446274:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }